

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

int __thiscall BoardView::ConfigParse(BoardView *this)

{
  ImGuiStyle *this_00;
  Confparse *in_RDI;
  ImGuiStyle *style;
  Confparse *in_stack_00000128;
  ColorScheme *in_stack_00000130;
  Confparse *in_stack_000001e8;
  KeyBindings *in_stack_000001f0;
  
  this_00 = ImGui::GetStyle();
  Config::readFromConfig((Config *)this_00,in_RDI);
  setDPI((int)((ulong)this_00 >> 0x20));
  this_00->AntiAliasedLines = (bool)((in_RDI[5].value[0x13f] ^ 0xffU) & 1);
  this_00->AntiAliasedFill = (bool)((in_RDI[5].value[0x13f] ^ 0xffU) & 1);
  *(float *)(in_RDI[5].value + 0xc68) = (float)*(int *)(in_RDI[5].value + 0x144);
  in_RDI->value[0xd8] = in_RDI[5].value[0x14a] & 1;
  ColorScheme::readFromConfig(in_stack_00000130,in_stack_00000128);
  KeyBindings::readFromConfig(in_stack_000001f0,in_stack_000001e8);
  return 0;
}

Assistant:

int BoardView::ConfigParse(void) {
	ImGuiStyle &style = ImGui::GetStyle();

	config.readFromConfig(obvconfig);

	setDPI(config.dpi);

	style.AntiAliasedLines = !config.slowCPU;
	style.AntiAliasedFill  = !config.slowCPU;

	m_info_surface.x = config.infoPanelWidth;
	backgroundImage.enabled = config.showBackgroundImage;

	m_colors.readFromConfig(obvconfig);
	keybindings.readFromConfig(obvconfig);

	return 0;
}